

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O1

void Abc_NtkShareFindBestMatch(Vec_Ptr_t *vBuckets,Vec_Int_t **pvInput,Vec_Int_t **pvInput2)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  int *piVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  uint *__ptr;
  void *pvVar11;
  void *__ptr_00;
  uint uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  int *piVar21;
  int *piVar22;
  Vec_Int_t *local_70;
  Vec_Int_t *local_68;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 0x28;
  __ptr[1] = 0;
  pvVar11 = malloc(0x140);
  *(void **)(__ptr + 2) = pvVar11;
  lVar18 = (long)vBuckets->nSize;
  if (0 < (long)vBuckets->nSize) {
    do {
      if (vBuckets->nSize < lVar18) goto LAB_002616ba;
      pvVar11 = vBuckets->pArray[lVar18 + -1];
      if (0 < *(int *)((long)pvVar11 + 4)) {
        uVar10 = __ptr[1];
        uVar12 = *__ptr;
        __ptr_00 = *(void **)(__ptr + 2);
        uVar20 = 0;
        do {
          uVar3 = *(undefined8 *)(*(long *)((long)pvVar11 + 8) + uVar20 * 8);
          if (uVar10 + (int)uVar20 == uVar12) {
            if ((int)uVar12 < 0x10) {
              if (__ptr_00 == (void *)0x0) {
                __ptr_00 = malloc(0x80);
              }
              else {
                __ptr_00 = realloc(__ptr_00,0x80);
              }
              uVar12 = 0x10;
            }
            else {
              uVar9 = uVar12 * 2;
              if (SBORROW4(uVar12,uVar9) != 0 < (int)uVar12) {
                uVar12 = uVar9;
                if (__ptr_00 == (void *)0x0) {
                  __ptr_00 = malloc((ulong)uVar9 << 3);
                }
                else {
                  __ptr_00 = realloc(__ptr_00,(ulong)uVar9 << 3);
                }
              }
            }
          }
          *(undefined8 *)((long)__ptr_00 + uVar20 * 8 + (long)(int)uVar10 * 8) = uVar3;
          if (0x27 - uVar10 == uVar20) {
            __ptr[1] = uVar10 + (int)uVar20 + 1;
            *__ptr = uVar12;
            *(void **)(__ptr + 2) = __ptr_00;
            goto LAB_002613f7;
          }
          uVar20 = uVar20 + 1;
        } while ((long)uVar20 < (long)*(int *)((long)pvVar11 + 4));
        __ptr[1] = uVar10 + (int)uVar20;
        *__ptr = uVar12;
        *(void **)(__ptr + 2) = __ptr_00;
      }
      bVar8 = 1 < lVar18;
      lVar18 = lVar18 + -1;
    } while (bVar8);
  }
LAB_002613f7:
  lVar18 = (long)(int)__ptr[1];
  iVar13 = 0;
  if (lVar18 < 1) {
    local_70 = (Vec_Int_t *)0x0;
    local_68 = (Vec_Int_t *)0x0;
  }
  else {
    lVar14 = *(long *)(__ptr + 2);
    iVar16 = 0;
    local_68 = (Vec_Int_t *)0x0;
    local_70 = (Vec_Int_t *)0x0;
    lVar17 = lVar18;
    do {
      pVVar4 = *(Vec_Int_t **)(lVar14 + -8 + lVar17 * 8);
      lVar19 = lVar18;
      do {
        if (lVar17 != lVar19) {
          pVVar5 = *(Vec_Int_t **)(lVar14 + -8 + lVar19 * 8);
          pVVar4->pArray = pVVar4->pArray + 2;
          piVar6 = pVVar5->pArray;
          piVar21 = piVar6 + 2;
          pVVar5->pArray = piVar21;
          pVVar4->nSize = pVVar4->nSize + -2;
          iVar1 = pVVar5->nSize;
          pVVar5->nSize = iVar1 + -2;
          piVar7 = pVVar4->pArray;
          iVar2 = pVVar4->nSize;
          iVar15 = 0;
          if ((0 < (long)iVar2) && (2 < iVar1)) {
            iVar15 = 0;
            piVar22 = piVar7;
            do {
              if (*piVar22 == *piVar21) {
                piVar22 = piVar22 + 1;
                piVar21 = piVar21 + 1;
                iVar15 = iVar15 + 1;
              }
              else if (*piVar22 < *piVar21) {
                piVar22 = piVar22 + 1;
              }
              else {
                piVar21 = piVar21 + 1;
              }
            } while ((piVar22 < piVar7 + iVar2) && (piVar21 < piVar6 + iVar1));
          }
          pVVar4->pArray = piVar7 + -2;
          piVar21 = pVVar5->pArray;
          pVVar5->pArray = piVar21 + -2;
          pVVar4->nSize = iVar2 + 2;
          iVar1 = pVVar5->nSize;
          pVVar5->nSize = iVar1 + 2;
          if (1 < iVar15) {
            if ((pVVar4->nSize < 2) || (iVar1 < 0)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar1 = piVar21[-1];
            if (iVar1 < pVVar4->pArray[1]) {
              iVar1 = pVVar4->pArray[1];
            }
            if ((iVar16 < iVar15) || ((iVar16 == iVar15 && (iVar1 < iVar13)))) {
              iVar16 = iVar15;
              iVar13 = iVar1;
              local_70 = pVVar5;
              local_68 = pVVar4;
            }
          }
        }
        bVar8 = 1 < lVar19;
        lVar19 = lVar19 + -1;
      } while (bVar8);
      bVar8 = 1 < lVar17;
      lVar17 = lVar17 + -1;
    } while (bVar8);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  *pvInput = local_68;
  *pvInput2 = local_70;
  if (local_68 == (Vec_Int_t *)0x0) {
    return;
  }
  if ((1 < local_68->nSize) && (uVar10 = local_68->nSize - 2, (int)uVar10 < vBuckets->nSize)) {
    pvVar11 = vBuckets->pArray[uVar10];
    uVar10 = *(uint *)((long)pvVar11 + 4);
    lVar18 = (ulong)uVar10 + 1;
    do {
      if ((int)lVar18 + -1 < 1) goto LAB_0026169b;
      lVar14 = lVar18 + -1;
      lVar17 = lVar18 * 8;
      lVar18 = lVar14;
    } while (*(Vec_Int_t **)(*(long *)((long)pvVar11 + 8) + -0x10 + lVar17) != local_68);
    for (; (int)lVar14 < (int)uVar10; lVar14 = lVar14 + 1) {
      *(undefined8 *)(*(long *)((long)pvVar11 + 8) + -8 + lVar14 * 8) =
           *(undefined8 *)(*(long *)((long)pvVar11 + 8) + lVar14 * 8);
    }
    *(uint *)((long)pvVar11 + 4) = uVar10 - 1;
    if ((1 < local_70->nSize) && (uVar10 = local_70->nSize - 2, (int)uVar10 < vBuckets->nSize)) {
      pvVar11 = vBuckets->pArray[uVar10];
      uVar10 = *(uint *)((long)pvVar11 + 4);
      lVar18 = (ulong)uVar10 + 1;
      while (0 < (int)lVar18 + -1) {
        lVar14 = lVar18 + -1;
        lVar17 = lVar18 * 8;
        lVar18 = lVar14;
        if (*(Vec_Int_t **)(*(long *)((long)pvVar11 + 8) + -0x10 + lVar17) == local_70) {
          for (; (int)lVar14 < (int)uVar10; lVar14 = lVar14 + 1) {
            *(undefined8 *)(*(long *)((long)pvVar11 + 8) + -8 + lVar14 * 8) =
                 *(undefined8 *)(*(long *)((long)pvVar11 + 8) + lVar14 * 8);
          }
          *(uint *)((long)pvVar11 + 4) = uVar10 - 1;
          return;
        }
      }
LAB_0026169b:
      __assert_fail("i >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x2f6,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
    }
  }
LAB_002616ba:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Abc_NtkShareFindBestMatch( Vec_Ptr_t * vBuckets, Vec_Int_t ** pvInput, Vec_Int_t ** pvInput2 )
{
    int nPoolSize = 40;
    Vec_Ptr_t * vPool = Vec_PtrAlloc( nPoolSize );
    Vec_Ptr_t * vBucket;
    Vec_Int_t * vInput, * vInput2, * vInputBest = NULL, * vInputBest2 = NULL;
    int i, k, Cost, CostBest = 0, Delay, DelayBest = 0;

    Vec_PtrForEachEntryReverse( Vec_Ptr_t *, vBuckets, vBucket, i )
        Vec_PtrForEachEntry( Vec_Int_t *, vBucket, vInput, k )
        {
            Vec_PtrPush( vPool, vInput );
            if ( Vec_PtrSize(vPool) == nPoolSize )
                goto outside;
        }
outside:

    Vec_PtrForEachEntryReverse( Vec_Int_t *, vPool, vInput, i )
    Vec_PtrForEachEntryReverse( Vec_Int_t *, vPool, vInput2, k )
    {
        if ( i == k )
            continue;

        vInput->pArray += SHARE_NUM;
        vInput2->pArray += SHARE_NUM;
        vInput->nSize -= SHARE_NUM;
        vInput2->nSize -= SHARE_NUM;

        Cost = Vec_IntTwoCountCommon(vInput, vInput2);

        vInput->pArray -= SHARE_NUM;
        vInput2->pArray -= SHARE_NUM;
        vInput->nSize += SHARE_NUM;
        vInput2->nSize += SHARE_NUM;

        if ( Cost < 2 )
            continue;

        Delay = Abc_MaxInt( Vec_IntEntry(vInput, 1), Vec_IntEntry(vInput2, 1) );

        if ( CostBest < Cost || (CostBest == Cost && (DelayBest > Delay)) )
        {
            CostBest = Cost;
            DelayBest = Delay;
            vInputBest = vInput;
            vInputBest2 = vInput2;
        }
    }
    Vec_PtrFree( vPool );

    *pvInput  = vInputBest;
    *pvInput2 = vInputBest2;

    if ( vInputBest == NULL )
        return;

    Vec_PtrRemove( (Vec_Ptr_t *)Vec_PtrEntry(vBuckets, Vec_IntSize(vInputBest)-SHARE_NUM),  (Vec_Int_t *)vInputBest ); 
    Vec_PtrRemove( (Vec_Ptr_t *)Vec_PtrEntry(vBuckets, Vec_IntSize(vInputBest2)-SHARE_NUM), (Vec_Int_t *)vInputBest2 ); 
}